

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void perfetto::internal::TracingMuxerImpl::ResetForTesting(void)

{
  undefined *puVar1;
  uint uVar2;
  pointer pTVar3;
  function<void_()> local_b0;
  undefined1 local_80 [8];
  anon_class_16_2_d8df310c do_reset;
  WaitableEvent reset_done;
  TracingMuxerImpl *muxer;
  
  puVar1 = TracingMuxer::instance_;
  perfetto::base::WaitableEvent::WaitableEvent((WaitableEvent *)&do_reset.reset_done);
  local_80 = (undefined1  [8])puVar1;
  do_reset.muxer = (TracingMuxerImpl *)&do_reset.reset_done;
  pTVar3 = std::
           unique_ptr<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
           ::operator->((unique_ptr<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
                         *)(puVar1 + 0x18));
  uVar2 = (*pTVar3->_vptr_TaskRunner[6])();
  if ((uVar2 & 1) == 0) {
    pTVar3 = std::
             unique_ptr<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
             ::operator->((unique_ptr<perfetto::base::TaskRunner,_std::default_delete<perfetto::base::TaskRunner>_>
                           *)(puVar1 + 0x18));
    ::std::function<void()>::
    function<perfetto::internal::TracingMuxerImpl::ResetForTesting()::__0,void>
              ((function<void()> *)&local_b0,(anon_class_16_2_d8df310c *)local_80);
    (*pTVar3->_vptr_TaskRunner[2])(pTVar3,&local_b0);
    ::std::function<void_()>::~function(&local_b0);
    perfetto::base::WaitableEvent::Wait((WaitableEvent *)&do_reset.reset_done);
  }
  else {
    ResetForTesting::anon_class_16_2_d8df310c::operator()((anon_class_16_2_d8df310c *)local_80);
  }
  perfetto::base::WaitableEvent::~WaitableEvent((WaitableEvent *)&do_reset.reset_done);
  return;
}

Assistant:

void TracingMuxerImpl::ResetForTesting() {
  // Ideally we'd tear down the entire TracingMuxerImpl, but the lifetimes of
  // various objects make that a non-starter. In particular:
  //
  // 1) Any thread that has entered a trace event has a TraceWriter, which holds
  //    a reference back to ProducerImpl::service_.
  //
  // 2) ProducerImpl::service_ has a reference back to the ProducerImpl.
  //
  // 3) ProducerImpl holds reference to TracingMuxerImpl::task_runner_, which in
  //    turn depends on TracingMuxerImpl itself.
  //
  // Because of this, it's not safe to deallocate TracingMuxerImpl until all
  // threads have dropped their TraceWriters. Since we can't really ask the
  // caller to guarantee this, we'll instead reset enough of the muxer's state
  // so that it can be reinitialized later and ensure all necessary objects from
  // the old state remain alive until all references have gone away.
  auto* muxer = reinterpret_cast<TracingMuxerImpl*>(instance_);

  base::WaitableEvent reset_done;
  auto do_reset = [muxer, &reset_done] {
    // Unregister all data sources so they don't interfere with any future
    // tracing sessions.
    for (RegisteredDataSource& rds : muxer->data_sources_) {
      for (RegisteredBackend& backend : muxer->backends_) {
        if (!backend.producer->service_)
          continue;
        backend.producer->service_->UnregisterDataSource(rds.descriptor.name());
      }
    }
    for (auto& backend : muxer->backends_) {
      // Check that no consumer session is currently active on any backend.
      for (auto& consumer : backend.consumers)
        PERFETTO_CHECK(!consumer->service_);
      backend.producer->muxer_ = nullptr;
      backend.producer->DisposeConnection();
      muxer->dead_backends_.push_back(std::move(backend));
    }
    muxer->backends_.clear();
    muxer->interceptors_.clear();

    for (auto& ds : muxer->data_sources_) {
      ds.static_state->~DataSourceStaticState();
      new (ds.static_state) DataSourceStaticState{};
    }
    muxer->data_sources_.clear();
    muxer->next_data_source_index_ = 0;

    // Free all backends without active trace writers or other inbound
    // references. Note that even if all the backends get swept, the muxer still
    // needs to stay around since |task_runner_| is assumed to be long-lived.
    muxer->SweepDeadBackends();

    // Make sure we eventually discard any per-thread trace writers from the
    // previous instance.
    muxer->muxer_id_for_testing_++;

    g_prev_instance = muxer;
    instance_ = TracingMuxerFake::Get();
    reset_done.Notify();
  };

  // Some tests run the muxer and the test on the same thread. In these cases,
  // we can reset synchronously.
  if (muxer->task_runner_->RunsTasksOnCurrentThread()) {
    do_reset();
  } else {
    muxer->task_runner_->PostTask(std::move(do_reset));
    reset_done.Wait();
  }
}